

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepCompositing.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepCompositing::composite_pixel
          (DeepCompositing *this,float *outputs,float **inputs,char **channel_names,int num_channels
          ,int num_samples,int sources)

{
  float fVar1;
  reference pvVar2;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int c;
  float alpha;
  int s;
  int i_2;
  int i_1;
  vector<int,_std::allocator<int>_> sort_order;
  int i;
  int local_80;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar3;
  int local_58;
  vector<int,_std::allocator<int>_> local_48;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 local_20;
  long local_18;
  long local_10;
  
  for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
    *(undefined4 *)(in_RSI + (long)local_2c * 4) = 0;
  }
  if (in_R9D != 0) {
    local_28 = in_R9D;
    local_24 = in_R8D;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a1593);
    if (1 < in_stack_00000008) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      for (local_58 = 0; local_58 < local_28; local_58 = local_58 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_58);
        *pvVar2 = local_58;
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,0);
      (**(code **)(*in_RDI + 0x18))
                (in_RDI,pvVar2,local_18,local_20,local_24,local_28,in_stack_00000008);
    }
    local_80 = 0;
    while (local_80 < local_28) {
      iVar3 = local_80;
      if (1 < in_stack_00000008) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_80);
        local_80 = *pvVar2;
      }
      fVar1 = *(float *)(local_10 + 8);
      if (1.0 <= fVar1) break;
      for (in_stack_ffffffffffffff94 = 0; in_stack_ffffffffffffff94 < local_24;
          in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
        *(float *)(local_10 + (long)in_stack_ffffffffffffff94 * 4) =
             (1.0 - fVar1) *
             *(float *)(*(long *)(local_18 + (long)in_stack_ffffffffffffff94 * 8) +
                       (long)local_80 * 4) +
             *(float *)(local_10 + (long)in_stack_ffffffffffffff94 * 4);
      }
      local_80 = iVar3 + 1;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  return;
}

Assistant:

void
DeepCompositing::composite_pixel (
    float        outputs[],
    const float* inputs[],
    const char*  channel_names[],
    int          num_channels,
    int          num_samples,
    int          sources)
{
    for (int i = 0; i < num_channels; i++)
        outputs[i] = 0.0;
    // no samples? do nothing
    if (num_samples == 0) { return; }

    vector<int> sort_order;
    if (sources > 1)
    {
        sort_order.resize (num_samples);
        for (int i = 0; i < num_samples; i++)
            sort_order[i] = i;
        sort (
            &sort_order[0],
            inputs,
            channel_names,
            num_channels,
            num_samples,
            sources);
    }

    for (int i = 0; i < num_samples; i++)
    {
        int   s     = (sources > 1) ? sort_order[i] : i;
        float alpha = outputs[2];
        if (alpha >= 1.0f) return;

        for (int c = 0; c < num_channels; c++)
        {
            outputs[c] += (1.0f - alpha) * inputs[c][s];
        }
    }
}